

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<int_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,double *rhs)

{
  int iVar1;
  lest *this_00;
  double *in_R8;
  allocator<char> local_71;
  double local_70;
  string local_68;
  string local_48 [32];
  
  this_00 = *(lest **)this;
  iVar1 = *(int *)this_00;
  local_70 = *rhs;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"!=",&local_71);
  to_string<int,double>(&local_68,this_00,(int *)local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = local_70 != (double)iVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }